

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_access_block_idx(Integer g_a,Integer idx,AccessIndex *index,Integer *ld)

{
  long lVar1;
  Integer IVar2;
  ulong uVar3;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long lptr;
  unsigned_long lref;
  unsigned_long elemsize;
  Integer iblock;
  Integer handle;
  char *ptr;
  Integer in_stack_00000138;
  char *in_stack_00000140;
  Integer *in_stack_00000268;
  void *in_stack_00000270;
  Integer in_stack_00000278;
  Integer in_stack_00000280;
  DoubleComplex *local_48;
  ulong local_28;
  
  lVar1 = in_RDI + 1000;
  local_48 = (DoubleComplex *)0x0;
  if ((in_RSI < 0) || (GA[lVar1].block_total <= in_RSI)) {
    pnga_error(in_stack_00000140,in_stack_00000138);
  }
  pnga_access_block_ptr(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
  uVar3 = (ulong)GA[lVar1].elemsize;
  IVar2 = pnga_type_c2f((long)GA[lVar1].type);
  switch(IVar2) {
  case 0x3f2:
    *in_RDX = (long)(local_28 - (long)INT_MB) >> 3;
    local_48 = (DoubleComplex *)INT_MB;
    break;
  case 0x3f4:
    *in_RDX = (long)(local_28 - (long)FLT_MB) >> 2;
    local_48 = (DoubleComplex *)FLT_MB;
    break;
  case 0x3f5:
    *in_RDX = (long)(local_28 - (long)DBL_MB) >> 3;
    local_48 = (DoubleComplex *)DBL_MB;
    break;
  case 0x3f6:
    *in_RDX = (long)(local_28 - (long)SCPL_MB) >> 3;
    local_48 = (DoubleComplex *)SCPL_MB;
    break;
  case 0x3f7:
    *in_RDX = (long)(local_28 - (long)DCPL_MB) >> 4;
    local_48 = DCPL_MB;
  }
  if (local_28 % uVar3 != (ulong)local_48 % uVar3) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",GAme & 0xffffffff,local_28,local_28 % uVar3,local_48,
           (ulong)local_48 % uVar3);
    pnga_error(in_stack_00000140,in_stack_00000138);
  }
  *in_RDX = *in_RDX + 1;
  return;
}

Assistant:

void pnga_access_block_idx(Integer g_a, Integer idx, AccessIndex* index, Integer *ld)
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  /*p_handle,*/ iblock;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   /*p_handle = GA[handle].p_handle;*/
   iblock = idx;
   if (iblock < 0 || iblock >= GA[handle].block_total)
     pnga_error("block index outside allowed values",iblock);

   pnga_access_block_ptr(g_a,iblock,&ptr,ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}